

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceBundle *
ures_getByIndex_63(UResourceBundle *resB,int32_t indexR,UResourceBundle *fillIn,UErrorCode *status)

{
  UBool UVar1;
  uint uVar2;
  Resource RVar3;
  UResourceBundle *pUVar4;
  char *pcStack_38;
  Resource r;
  char *key;
  UErrorCode *status_local;
  UResourceBundle *fillIn_local;
  UResourceBundle *pUStack_18;
  int32_t indexR_local;
  UResourceBundle *resB_local;
  
  pcStack_38 = (char *)0x0;
  status_local = (UErrorCode *)fillIn;
  if ((status == (UErrorCode *)0x0) ||
     (key = (char *)status, fillIn_local._4_4_ = indexR, pUStack_18 = resB,
     UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    resB_local = (UResourceBundle *)status_local;
  }
  else if (pUStack_18 == (UResourceBundle *)0x0) {
    key[0] = '\x01';
    key[1] = '\0';
    key[2] = '\0';
    key[3] = '\0';
    resB_local = (UResourceBundle *)status_local;
  }
  else if ((fillIn_local._4_4_ < 0) || (pUStack_18->fSize <= fillIn_local._4_4_)) {
    key[0] = '\x02';
    key[1] = '\0';
    key[2] = '\0';
    key[3] = '\0';
    resB_local = (UResourceBundle *)status_local;
  }
  else {
    uVar2 = pUStack_18->fRes >> 0x1c;
    if (1 < uVar2) {
      if ((uVar2 == 2) || (uVar2 - 4 < 2)) {
        RVar3 = res_getTableItemByIndex_63
                          (&pUStack_18->fResData,pUStack_18->fRes,fillIn_local._4_4_,
                           &stack0xffffffffffffffc8);
        pUVar4 = init_resb_result(&pUStack_18->fResData,RVar3,pcStack_38,fillIn_local._4_4_,
                                  pUStack_18->fData,pUStack_18,0,(UResourceBundle *)status_local,
                                  (UErrorCode *)key);
        return pUVar4;
      }
      if (1 < uVar2 - 6) {
        if (uVar2 - 8 < 2) {
          RVar3 = res_getArrayItem_63(&pUStack_18->fResData,pUStack_18->fRes,fillIn_local._4_4_);
          pUVar4 = init_resb_result(&pUStack_18->fResData,RVar3,pcStack_38,fillIn_local._4_4_,
                                    pUStack_18->fData,pUStack_18,0,(UResourceBundle *)status_local,
                                    (UErrorCode *)key);
          return pUVar4;
        }
        if (uVar2 != 0xe) {
          return (UResourceBundle *)status_local;
        }
      }
    }
    resB_local = ures_copyResb_63((UResourceBundle *)status_local,pUStack_18,(UErrorCode *)key);
  }
  return resB_local;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2 ures_getByIndex(const UResourceBundle *resB, int32_t indexR, UResourceBundle *fillIn, UErrorCode *status) {
    const char* key = NULL;
    Resource r = RES_BOGUS;

    if (status==NULL || U_FAILURE(*status)) {
        /*return NULL;*/
        return fillIn;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        /*return NULL;*/
        return fillIn;
    }

    if(indexR >= 0 && resB->fSize > indexR) {
        switch(RES_GET_TYPE(resB->fRes)) {
        case URES_INT:
        case URES_BINARY:
        case URES_STRING:
        case URES_STRING_V2:
        case URES_INT_VECTOR:
            return ures_copyResb(fillIn, resB, status);
        case URES_TABLE:
        case URES_TABLE16:
        case URES_TABLE32:
            r = res_getTableItemByIndex(&(resB->fResData), resB->fRes, indexR, &key);
            if(r == RES_BOGUS && resB->fHasFallback) {
                /* TODO: do the fallback */
            }
            return init_resb_result(&(resB->fResData), r, key, indexR, resB->fData, resB, 0, fillIn, status);
        case URES_ARRAY:
        case URES_ARRAY16:
            r = res_getArrayItem(&(resB->fResData), resB->fRes, indexR);
            if(r == RES_BOGUS && resB->fHasFallback) {
                /* TODO: do the fallback */
            }
            return init_resb_result(&(resB->fResData), r, key, indexR, resB->fData, resB, 0, fillIn, status);
        default:
            /*return NULL;*/
            return fillIn;
        }
    } else {
        *status = U_MISSING_RESOURCE_ERROR;
    }
    /*return NULL;*/
    return fillIn;
}